

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void licm_move_insn(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn,bb_t_conflict to,
                   bb_insn_t_conflict before)

{
  MIR_context_t ctx_00;
  bb_t_conflict pbVar1;
  MIR_insn_t elem;
  bb_insn_t_conflict before_00;
  bb_insn_t_conflict last;
  MIR_insn_t insn;
  bb_t_conflict bb;
  MIR_context_t ctx;
  bb_insn_t_conflict before_local;
  bb_t_conflict to_local;
  bb_insn_t_conflict bb_insn_local;
  gen_ctx_t gen_ctx_local;
  
  ctx_00 = gen_ctx->ctx;
  pbVar1 = bb_insn->bb;
  elem = bb_insn->insn;
  before_00 = DLIST_bb_insn_t_tail(&to->bb_insns);
  if (before != (bb_insn_t_conflict)0x0) {
    DLIST_bb_insn_t_remove(&pbVar1->bb_insns,bb_insn);
    DLIST_MIR_insn_t_remove(&((gen_ctx->curr_func_item->u).func)->insns,elem);
    if ((before_00 == (bb_insn_t_conflict)0x0) ||
       ((int)*(undefined8 *)&before_00->insn->field_0x18 != 0x76)) {
      DLIST_bb_insn_t_append(&to->bb_insns,bb_insn);
      MIR_insert_insn_before(ctx_00,gen_ctx->curr_func_item,before->insn,elem);
    }
    else {
      DLIST_bb_insn_t_insert_before(&to->bb_insns,before_00,bb_insn);
      MIR_insert_insn_before(ctx_00,gen_ctx->curr_func_item,before_00->insn,elem);
    }
    bb_insn->bb = to;
    return;
  }
  __assert_fail("before != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x14d2,"void licm_move_insn(gen_ctx_t, bb_insn_t, bb_t, bb_insn_t)");
}

Assistant:

static void licm_move_insn (gen_ctx_t gen_ctx, bb_insn_t bb_insn, bb_t to, bb_insn_t before) {
  MIR_context_t ctx = gen_ctx->ctx;
  bb_t bb = bb_insn->bb;
  MIR_insn_t insn = bb_insn->insn;
  bb_insn_t last = DLIST_TAIL (bb_insn_t, to->bb_insns);

  gen_assert (before != NULL);
  DLIST_REMOVE (bb_insn_t, bb->bb_insns, bb_insn);
  DLIST_REMOVE (MIR_insn_t, curr_func_item->u.func->insns, insn);
  if (last != NULL && last->insn->code == MIR_JMP) {
    DLIST_INSERT_BEFORE (bb_insn_t, to->bb_insns, last, bb_insn);
    MIR_insert_insn_before (ctx, curr_func_item, last->insn, insn);
  } else {
    DLIST_APPEND (bb_insn_t, to->bb_insns, bb_insn);
    MIR_insert_insn_before (ctx, curr_func_item, before->insn, insn);
  }
  bb_insn->bb = to;
}